

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O0

bool __thiscall
tlx::CmdlineParser::ArgumentString::process(ArgumentString *this,int *argc,char ***argv)

{
  int iVar1;
  char ***argv_local;
  int *argc_local;
  ArgumentString *this_local;
  
  iVar1 = *argc;
  if (iVar1 != 0) {
    std::__cxx11::string::operator=((string *)this->dest_,**argv);
    *argc = *argc + -1;
    *argv = *argv + 1;
  }
  return iVar1 != 0;
}

Assistant:

bool process(int& argc, const char* const*& argv) final { // NOLINT
        if (argc == 0)
            return false;
        dest_ = argv[0];
        --argc, ++argv;
        return true;
    }